

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O2

void __thiscall
libDAI::FactorGraph::FactorGraph
          (FactorGraph *this,
          vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *P)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Iter in_R8;
  ulong uVar5;
  pointer pVVar6;
  _Self __tmp;
  pointer __x;
  ulong uVar7;
  insert_iterator<std::set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_>_>
  __result;
  VarSet ns;
  set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_> _vars;
  pair<unsigned_long,_unsigned_long> local_90;
  VarSet local_80;
  _Rb_tree<libDAI::Var,_libDAI::Var,_std::_Identity<libDAI::Var>,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_>
  local_60;
  
  p_Var1 = &(this->_backupFactors)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  (this->super_GraphicalModel)._normType = NORMPROB;
  (this->super_GraphicalModel)._vptr_GraphicalModel = (_func_int **)&PTR__FactorGraph_0061e838;
  (this->_fg)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_fg)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_fg)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_fg)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_fg)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_fg)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_fg)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_fg)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_fg)._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_fg)._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_fg)._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_fg)._V2.
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_fg)._V2.
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_fg)._V2.
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_fg)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_fg)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_fg)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_fg)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_fg)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_fg)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_fg)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->_backupFactors)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_backupFactors)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_backupFactors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_backupFactors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_backupFactors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_backupFactors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  __x = (P->super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>).
        _M_impl.super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  for (; p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left,
      __x != (P->
             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              (&(this->_fg)._V2,__x);
    __result.iter._M_node = in_R8._M_node;
    __result.container =
         (set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_> *)
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<libDAI::Var_const*,std::insert_iterator<std::set<libDAI::Var,std::less<libDAI::Var>,std::allocator<libDAI::Var>>>>
              ((__copy_move<false,false,std::random_access_iterator_tag> *)
               (__x->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (__x->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
               _M_impl.super__Vector_impl_data._M_finish,(Var *)&local_60,__result);
  }
  for (; (_Rb_tree_header *)p_Var4 != p_Var2;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::push_back
              (&(this->_fg)._V1,(value_type *)(p_Var4 + 1));
  }
  uVar5 = 0;
  do {
    iVar3 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[9])(this);
    if (CONCAT44(extraout_var,iVar3) <= uVar5) {
      BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_>::Regenerate(&this->_fg);
      std::
      _Rb_tree<libDAI::Var,_libDAI::Var,_std::_Identity<libDAI::Var>,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_>
      ::~_Rb_tree(&local_60);
      return;
    }
    iVar3 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[10])(this,uVar5);
    VarSet::VarSet(&local_80,(VarSet *)CONCAT44(extraout_var_00,iVar3));
    for (pVVar6 = local_80._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pVVar6 != local_80._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pVVar6 = pVVar6 + 1) {
      for (uVar7 = 0; iVar3 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[5])(this),
          uVar7 < CONCAT44(extraout_var_01,iVar3); uVar7 = uVar7 + 1) {
        iVar3 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[6])(this,uVar7);
        if (*(long *)CONCAT44(extraout_var_02,iVar3) == pVVar6->_label) {
          local_90.first = uVar7;
          local_90.second = uVar5;
          std::
          vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                    ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                      *)&(this->_fg)._E12,&local_90);
          break;
        }
      }
    }
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_80);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

FactorGraph::FactorGraph( const std::vector<Factor> &P ) : GraphicalModel(), _fg(), _backupFactors() {
        // add Factors
        set<Var> _vars;
        for(vector<Factor>::const_iterator p2 = P.begin(); p2 != P.end(); p2++ ) {
            _fg.V2s().push_back(*p2);
            copy( p2->vars().begin(), p2->vars().end(), inserter( _vars, _vars.begin() ) );
        }

        // add _vars
        for(set<Var>::const_iterator p1 = _vars.begin(); p1 != _vars.end(); p1++ )
            _fg.V1s().push_back(*p1);

        // create edges
        for(size_t i2 = 0; i2 < nrFactors(); i2++ ) {
            VarSet ns = factor(i2).vars();
            for(VarSet::const_iterator q = ns.begin(); q != ns.end(); q++ ) {
                for(size_t i1=0; i1 < nrVars(); i1++ ) {
                    if (var(i1) == *q) {
                        _fg.edges().push_back(edge_type(i1,i2));
                        break;
                    }
                }
            }
        }

        // calc neighbours and adjacency matrix
        Regenerate();
    }